

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O0

string * __thiscall wallet::TxStateConfirmed::toString_abi_cxx11_(TxStateConfirmed *this)

{
  char *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  base_blob<256U> *in_stack_ffffffffffffff90;
  int *args_2;
  int *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  int local_28 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  args_2 = local_28;
  base_blob<256u>::ToString_abi_cxx11_(in_stack_ffffffffffffff90);
  tinyformat::format<std::__cxx11::string,int,int>
            (in_RSI,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,args_2);
  std::__cxx11::string::~string(in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string toString() const { return strprintf("Confirmed (block=%s, height=%i, index=%i)", confirmed_block_hash.ToString(), confirmed_block_height, position_in_block); }